

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

size_t __thiscall
(anonymous_namespace)::ExprHasher::
VisitBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
          (ExprHasher *this,
          BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
          e)

{
  size_t sVar1;
  ExprHasher *this_00;
  ulong uVar2;
  
  uVar2 = (long)*(int *)this + 0x9e3779b9;
  this_00 = this;
  sVar1 = std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                    ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)this,
                     (Expr)*(Impl **)(this + 8));
  uVar2 = sVar1 + uVar2 * 0x40 + (uVar2 >> 2) + 0x9e3779b9 ^ uVar2;
  sVar1 = std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                    ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)this_00,
                     (Expr)*(Impl **)(this + 0x10));
  return sVar1 + uVar2 * 0x40 + (uVar2 >> 2) + 0x9e3779b9 ^ uVar2;
}

Assistant:

size_t VisitBinary(E e) { return HashCombine(Hash(e, e.lhs()), e.rhs()); }